

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

MessageType __thiscall
cmMakefile::ExpandVariablesInStringNew
          (cmMakefile *this,string *errorstr,string *source,bool escapeQuotes,bool noEscapes,
          bool atOnly,char *filename,long line,bool removeEmpty,bool replaceAt)

{
  char cVar1;
  bool bVar2;
  undefined8 uVar3;
  __type _Var4;
  bool bVar5;
  int iVar6;
  cmake *pcVar7;
  cmState *this_00;
  reference pvVar8;
  char *pcVar9;
  long lVar10;
  size_type sVar11;
  size_t sVar12;
  ulong uVar13;
  size_type sVar14;
  ostream *poVar15;
  bool bVar16;
  bool local_9c3;
  string local_940 [32];
  undefined1 local_920 [8];
  ostringstream emsg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  string local_748;
  allocator local_721;
  undefined1 local_720 [8];
  string varresult_1;
  undefined1 local_6f8 [8];
  string variable;
  char *nextAt;
  char nextc_1;
  char *next_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  char local_651;
  char *pcStack_650;
  char nextc;
  char *start;
  char *next;
  t_lookup lookup_1;
  allocator local_609;
  string local_608;
  string local_5e8;
  cmState *local_5c8;
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_5c0;
  PositionType local_5b8;
  undefined1 local_5b0 [8];
  cmOutputConverter converter;
  cmListFileContext lfc;
  ostringstream msg;
  allocator local_3c9;
  string local_3c8;
  byte local_3a3;
  byte local_3a2;
  allocator local_3a1;
  string local_3a0;
  byte local_37b;
  byte local_37a;
  allocator local_379;
  string local_378;
  byte local_353;
  byte local_352;
  allocator local_351;
  string local_350;
  allocator local_329;
  string local_328;
  string local_308;
  string local_2e8 [32];
  ostringstream local_2c8 [8];
  ostringstream ostr;
  allocator local_149;
  string local_148 [8];
  string varresult;
  char *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  string *lookup;
  t_lookup var;
  char inc;
  cmState *state;
  undefined1 local_d0 [4];
  MessageType mtype;
  byte local_ba;
  byte local_b9;
  undefined1 local_b8 [6];
  bool done;
  bool error;
  stack<t_lookup,_std::deque<t_lookup,_std::allocator<t_lookup>_>_> openstack;
  string local_58 [8];
  string result;
  char *last;
  char *in;
  bool replaceAt_local;
  bool removeEmpty_local;
  bool atOnly_local;
  bool noEscapes_local;
  bool escapeQuotes_local;
  string *source_local;
  string *errorstr_local;
  cmMakefile *this_local;
  
  last = (char *)std::__cxx11::string::c_str();
  result.field_2._8_8_ = last;
  std::__cxx11::string::string(local_58);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)local_58);
  std::stack<t_lookup,std::deque<t_lookup,std::allocator<t_lookup>>>::
  stack<std::deque<t_lookup,std::allocator<t_lookup>>,void>
            ((stack<t_lookup,std::deque<t_lookup,std::allocator<t_lookup>>> *)local_b8);
  local_b9 = 0;
  local_ba = 0;
  t_lookup::t_lookup((t_lookup *)local_d0);
  std::stack<t_lookup,_std::deque<t_lookup,_std::allocator<t_lookup>_>_>::push
            ((stack<t_lookup,_std::deque<t_lookup,_std::allocator<t_lookup>_>_> *)local_b8,
             (value_type *)local_d0);
  state._4_4_ = LOG;
  pcVar7 = GetCMakeInstance(this);
  this_00 = cmake::GetState(pcVar7);
  do {
    var.loc._7_1_ = *last;
    if (var.loc._7_1_ == '\0') {
      local_ba = 1;
    }
    else if (var.loc._7_1_ == '\n') {
      line = line + 1;
    }
    else if (var.loc._7_1_ == '$') {
      if (atOnly) {
LAB_005938ac:
        if (!noEscapes) {
          cVar1 = last[1];
          if (cVar1 == 't') {
            std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
            std::__cxx11::string::append((char *)local_58);
            result.field_2._8_8_ = last + 2;
          }
          else if (cVar1 == 'n') {
            std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
            std::__cxx11::string::append((char *)local_58);
            result.field_2._8_8_ = last + 2;
          }
          else if (cVar1 == 'r') {
            std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
            std::__cxx11::string::append((char *)local_58);
            result.field_2._8_8_ = last + 2;
          }
          else if ((cVar1 != ';') ||
                  (sVar14 = std::stack<t_lookup,_std::deque<t_lookup,_std::allocator<t_lookup>_>_>::
                            size((stack<t_lookup,_std::deque<t_lookup,_std::allocator<t_lookup>_>_>
                                  *)local_b8), sVar14 != 1)) {
            iVar6 = isalnum((int)cVar1);
            if ((iVar6 == 0) && (cVar1 != '\0')) {
              std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
              result.field_2._8_8_ = last + 1;
            }
            else {
              std::__cxx11::string::operator+=((string *)errorstr,"Invalid character escape \'\\");
              if (cVar1 == '\0') {
                std::__cxx11::string::operator+=((string *)errorstr,"\' (at end of input).");
              }
              else {
                std::__cxx11::string::operator+=((string *)errorstr,cVar1);
                std::__cxx11::string::operator+=((string *)errorstr,"\'.");
              }
              local_b9 = 1;
            }
          }
          if (*(char *)result.field_2._8_8_ != '\0') {
            last = last + 1;
          }
        }
      }
      else {
        t_lookup::t_lookup((t_lookup *)&next);
        start = last + 1;
        pcStack_650 = (char *)0x0;
        local_651 = *start;
        if (local_651 == '{') {
          pcStack_650 = last + 2;
          next._0_4_ = 0;
        }
        else if (local_651 != '<') {
          if (local_651 == '\0') {
            std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
            result.field_2._8_8_ = start;
          }
          else {
            bVar16 = cmHasLiteralPrefix<char_const*,5ul>(start,(char (*) [5])"ENV{");
            if (bVar16) {
              pcStack_650 = last + 5;
              next._0_4_ = 1;
            }
            else {
              bVar16 = cmHasLiteralPrefix<char_const*,7ul>(start,(char (*) [7])"CACHE{");
              if (bVar16) {
                pcStack_650 = last + 7;
                next._0_4_ = 2;
              }
              else {
                bVar16 = cmsys::RegularExpression::find(&this->cmNamedCurly,start);
                pcVar9 = start;
                if (bVar16) {
                  sVar11 = cmsys::RegularExpression::end(&this->cmNamedCurly);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_6b8,pcVar9,sVar11,(allocator *)((long)&next_1 + 7));
                  std::operator+(&local_698,"Syntax $",&local_6b8);
                  std::operator+(&local_678,&local_698,
                                 "{} is not supported.  Only ${}, $ENV{}, and $CACHE{} are allowed."
                                );
                  std::__cxx11::string::operator=((string *)errorstr,(string *)&local_678);
                  std::__cxx11::string::~string((string *)&local_678);
                  std::__cxx11::string::~string((string *)&local_698);
                  std::__cxx11::string::~string((string *)&local_6b8);
                  std::allocator<char>::~allocator((allocator<char> *)((long)&next_1 + 7));
                  state._4_4_ = FATAL_ERROR;
                  local_b9 = 1;
                }
              }
            }
          }
        }
        if (pcStack_650 != (char *)0x0) {
          std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
          result.field_2._8_8_ = pcStack_650;
          last = pcStack_650 + -1;
          lookup_1._0_8_ = std::__cxx11::string::size();
          std::stack<t_lookup,_std::deque<t_lookup,_std::allocator<t_lookup>_>_>::push
                    ((stack<t_lookup,_std::deque<t_lookup,_std::allocator<t_lookup>_>_> *)local_b8,
                     (value_type *)&next);
        }
      }
    }
    else if (var.loc._7_1_ == '@') {
      if ((((replaceAt) &&
           (pcVar9 = strchr(last + 1,0x40), variable.field_2._8_8_ = pcVar9, pcVar9 != (char *)0x0))
          && (pcVar9 != last + 1)) &&
         (sVar12 = strspn(last + 1,
                          "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789/_.+-"),
         pcVar9 == last + sVar12 + 1)) {
        uVar13 = ~(ulong)last + variable.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_6f8,last + 1,uVar13,
                   (allocator *)(varresult_1.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator
                  ((allocator<char> *)(varresult_1.field_2._M_local_buf + 0xf));
        pcVar9 = GetSafeDefinition(this,(string *)local_6f8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_720,pcVar9,&local_721);
        std::allocator<char>::~allocator((allocator<char> *)&local_721);
        if (escapeQuotes) {
          cmSystemTools::EscapeQuotes(&local_748,(string *)local_720);
          std::__cxx11::string::operator=((string *)local_720,(string *)&local_748);
          std::__cxx11::string::~string((string *)&local_748);
        }
        std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
        std::__cxx11::string::append(local_58);
        last = (char *)variable.field_2._8_8_;
        result.field_2._8_8_ = variable.field_2._8_8_ + 1;
        std::__cxx11::string::~string((string *)local_720);
        std::__cxx11::string::~string((string *)local_6f8);
      }
      else {
LAB_00593d25:
        sVar14 = std::stack<t_lookup,_std::deque<t_lookup,_std::allocator<t_lookup>_>_>::size
                           ((stack<t_lookup,_std::deque<t_lookup,_std::allocator<t_lookup>_>_> *)
                            local_b8);
        if ((((1 < sVar14) && (iVar6 = isalnum((int)var.loc._7_1_), iVar6 == 0)) &&
            ((var.loc._7_1_ != '_' &&
             (((var.loc._7_1_ != '/' && (var.loc._7_1_ != '.')) && (var.loc._7_1_ != '+')))))) &&
           (var.loc._7_1_ != '-')) {
          std::__cxx11::string::operator+=((string *)errorstr,"Invalid character (\'");
          std::__cxx11::string::operator+=((string *)errorstr,var.loc._7_1_);
          std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
          std::stack<t_lookup,_std::deque<t_lookup,_std::allocator<t_lookup>_>_>::top
                    ((stack<t_lookup,_std::deque<t_lookup,_std::allocator<t_lookup>_>_> *)local_b8);
          std::__cxx11::string::substr((ulong)&local_7a8,(ulong)local_58);
          std::operator+(&local_788,"\') in a variable name: \'",&local_7a8);
          std::operator+(&local_768,&local_788,"\'");
          std::__cxx11::string::operator+=((string *)errorstr,(string *)&local_768);
          std::__cxx11::string::~string((string *)&local_768);
          std::__cxx11::string::~string((string *)&local_788);
          std::__cxx11::string::~string((string *)&local_7a8);
          state._4_4_ = FATAL_ERROR;
          local_b9 = 1;
        }
      }
    }
    else {
      if (var.loc._7_1_ == '\\') goto LAB_005938ac;
      if (var.loc._7_1_ != '}') goto LAB_00593d25;
      sVar14 = std::stack<t_lookup,_std::deque<t_lookup,_std::allocator<t_lookup>_>_>::size
                         ((stack<t_lookup,_std::deque<t_lookup,_std::allocator<t_lookup>_>_> *)
                          local_b8);
      if (1 < sVar14) {
        pvVar8 = std::stack<t_lookup,_std::deque<t_lookup,_std::allocator<t_lookup>_>_>::top
                           ((stack<t_lookup,_std::deque<t_lookup,_std::allocator<t_lookup>_>_> *)
                            local_b8);
        lookup = *(string **)pvVar8;
        var._0_8_ = pvVar8->loc;
        std::stack<t_lookup,_std::deque<t_lookup,_std::allocator<t_lookup>_>_>::pop
                  ((stack<t_lookup,_std::deque<t_lookup,_std::allocator<t_lookup>_>_> *)local_b8);
        std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
        std::__cxx11::string::substr((ulong)&value,(ulong)local_58);
        local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value;
        varresult.field_2._8_8_ = 0;
        std::__cxx11::string::string(local_148);
        if ((ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
             ::lineVar_abi_cxx11_ == '\0') &&
           (iVar6 = __cxa_guard_acquire(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                                         ::lineVar_abi_cxx11_), iVar6 != 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)
                     &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                      ::lineVar_abi_cxx11_,"CMAKE_CURRENT_LIST_LINE",&local_149);
          std::allocator<char>::~allocator((allocator<char> *)&local_149);
          __cxa_atexit(std::__cxx11::string::~string,
                       &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                        ::lineVar_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                               ::lineVar_abi_cxx11_);
        }
        if ((int)lookup == 0) {
          if ((filename == (char *)0x0) ||
             (_Var4 = std::operator==(local_100,
                                      &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                                       ::lineVar_abi_cxx11_), !_Var4)) {
            varresult.field_2._8_8_ = GetDefinition(this,local_100);
          }
          else {
            std::__cxx11::ostringstream::ostringstream(local_2c8);
            std::ostream::operator<<(local_2c8,line);
            std::__cxx11::ostringstream::str();
            std::__cxx11::string::operator=(local_148,local_2e8);
            std::__cxx11::string::~string(local_2e8);
            std::__cxx11::ostringstream::~ostringstream(local_2c8);
          }
        }
        else if ((int)lookup == 1) {
          pcVar9 = (char *)std::__cxx11::string::c_str();
          varresult.field_2._8_8_ = cmsys::SystemTools::GetEnv(pcVar9);
        }
        else if ((int)lookup == 2) {
          varresult.field_2._8_8_ = cmState::GetCacheEntryValue(this_00,local_100);
        }
        uVar3 = varresult.field_2._8_8_;
        if (varresult.field_2._8_8_ == 0) {
          if (!removeEmpty) {
            pcVar7 = GetCMakeInstance(this);
            bVar16 = cmake::GetWarnUninitialized(pcVar7);
            if ((bVar16) && (bVar16 = VariableInitialized(this,local_100), !bVar16)) {
              local_352 = 0;
              local_353 = 0;
              local_37a = 0;
              local_37b = 0;
              local_3a2 = 0;
              local_3a3 = 0;
              bVar2 = false;
              bVar16 = false;
              local_9c3 = true;
              if ((this->CheckSystemVars & 1U) == 0) {
                std::allocator<char>::allocator();
                local_352 = 1;
                std::__cxx11::string::string((string *)&local_350,filename,&local_351);
                local_353 = 1;
                pcVar9 = GetHomeDirectory(this);
                std::allocator<char>::allocator();
                local_37a = 1;
                std::__cxx11::string::string((string *)&local_378,pcVar9,&local_379);
                local_37b = 1;
                bVar5 = cmsys::SystemTools::IsSubDirectory(&local_350,&local_378);
                local_9c3 = true;
                if (!bVar5) {
                  std::allocator<char>::allocator();
                  local_3a2 = 1;
                  std::__cxx11::string::string((string *)&local_3a0,filename,&local_3a1);
                  local_3a3 = 1;
                  pcVar9 = GetHomeOutputDirectory(this);
                  std::allocator<char>::allocator();
                  bVar2 = true;
                  std::__cxx11::string::string((string *)&local_3c8,pcVar9,&local_3c9);
                  bVar16 = true;
                  local_9c3 = cmsys::SystemTools::IsSubDirectory(&local_3a0,&local_3c8);
                }
              }
              if (bVar16) {
                std::__cxx11::string::~string((string *)&local_3c8);
              }
              if (bVar2) {
                std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
              }
              if ((local_3a3 & 1) != 0) {
                std::__cxx11::string::~string((string *)&local_3a0);
              }
              if ((local_3a2 & 1) != 0) {
                std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
              }
              if ((local_37b & 1) != 0) {
                std::__cxx11::string::~string((string *)&local_378);
              }
              if ((local_37a & 1) != 0) {
                std::allocator<char>::~allocator((allocator<char> *)&local_379);
              }
              if ((local_353 & 1) != 0) {
                std::__cxx11::string::~string((string *)&local_350);
              }
              if ((local_352 & 1) != 0) {
                std::allocator<char>::~allocator((allocator<char> *)&local_351);
              }
              if (local_9c3 != false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&lfc.Line);
                cmListFileContext::cmListFileContext
                          ((cmListFileContext *)&converter.LinkScriptShell);
                local_5b8 = (this->StateSnapshot).Position.Position;
                local_5c8 = (this->StateSnapshot).State;
                pcStack_5c0 = (this->StateSnapshot).Position.Tree;
                cmOutputConverter::cmOutputConverter
                          ((cmOutputConverter *)local_5b0,this->StateSnapshot);
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_608,filename,&local_609);
                cmOutputConverter::Convert
                          (&local_5e8,(cmOutputConverter *)local_5b0,&local_608,HOME,UNCHANGED);
                std::__cxx11::string::operator=
                          ((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)&local_5e8);
                std::__cxx11::string::~string((string *)&local_5e8);
                std::__cxx11::string::~string((string *)&local_608);
                std::allocator<char>::~allocator((allocator<char> *)&local_609);
                lfc.FilePath.field_2._8_8_ = line;
                poVar15 = std::operator<<((ostream *)&lfc.Line,"uninitialized variable \'");
                poVar15 = std::operator<<(poVar15,(string *)local_100);
                std::operator<<(poVar15,"\'");
                pcVar7 = GetCMakeInstance(this);
                std::__cxx11::ostringstream::str();
                cmake::IssueMessage(pcVar7,AUTHOR_WARNING,(string *)&lookup_1.loc,
                                    (cmListFileContext *)&converter.LinkScriptShell);
                std::__cxx11::string::~string((string *)&lookup_1.loc);
                cmListFileContext::~cmListFileContext
                          ((cmListFileContext *)&converter.LinkScriptShell);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&lfc.Line);
              }
            }
          }
        }
        else if (escapeQuotes) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_328,(char *)uVar3,&local_329);
          cmSystemTools::EscapeQuotes(&local_308,&local_328);
          std::__cxx11::string::operator=(local_148,(string *)&local_308);
          std::__cxx11::string::~string((string *)&local_308);
          std::__cxx11::string::~string((string *)&local_328);
          std::allocator<char>::~allocator((allocator<char> *)&local_329);
        }
        else {
          std::__cxx11::string::operator=(local_148,(char *)varresult.field_2._8_8_);
        }
        uVar3 = var._0_8_;
        lVar10 = std::__cxx11::string::size();
        std::__cxx11::string::replace((ulong)local_58,uVar3,(string *)(lVar10 - var._0_8_));
        result.field_2._8_8_ = last + 1;
        std::__cxx11::string::~string(local_148);
        std::__cxx11::string::~string((string *)&value);
      }
    }
    bVar16 = false;
    if (((local_b9 & 1) == 0) && (bVar16 = false, (local_ba & 1) == 0)) {
      bVar16 = last[1] != '\0';
      last = last + 1;
    }
    if (!bVar16) {
      if (((local_b9 & 1) == 0) &&
         (sVar14 = std::stack<t_lookup,_std::deque<t_lookup,_std::allocator<t_lookup>_>_>::size
                             ((stack<t_lookup,_std::deque<t_lookup,_std::allocator<t_lookup>_>_> *)
                              local_b8), sVar14 != 1)) {
        std::__cxx11::string::operator+=
                  ((string *)errorstr,"There is an unterminated variable reference.");
        local_b9 = 1;
      }
      if ((local_b9 & 1) == 0) {
        std::__cxx11::string::append((char *)local_58);
        std::__cxx11::string::operator=((string *)source,local_58);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_920);
        std::operator<<((ostream *)local_920,"Syntax error in cmake code ");
        if (filename != (char *)0x0) {
          poVar15 = std::operator<<((ostream *)local_920,"at\n");
          poVar15 = std::operator<<(poVar15,"  ");
          poVar15 = std::operator<<(poVar15,filename);
          poVar15 = std::operator<<(poVar15,":");
          poVar15 = (ostream *)std::ostream::operator<<(poVar15,line);
          std::operator<<(poVar15,"\n");
        }
        poVar15 = std::operator<<((ostream *)local_920,"when parsing string\n");
        poVar15 = std::operator<<(poVar15,"  ");
        poVar15 = std::operator<<(poVar15,(string *)source);
        std::operator<<(poVar15,"\n");
        std::operator<<((ostream *)local_920,(string *)errorstr);
        state._4_4_ = FATAL_ERROR;
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=((string *)errorstr,local_940);
        std::__cxx11::string::~string(local_940);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_920);
      }
      std::stack<t_lookup,_std::deque<t_lookup,_std::allocator<t_lookup>_>_>::~stack
                ((stack<t_lookup,_std::deque<t_lookup,_std::allocator<t_lookup>_>_> *)local_b8);
      std::__cxx11::string::~string(local_58);
      return state._4_4_;
    }
  } while( true );
}

Assistant:

cmake::MessageType cmMakefile::ExpandVariablesInStringNew(
                                            std::string& errorstr,
                                            std::string& source,
                                            bool escapeQuotes,
                                            bool noEscapes,
                                            bool atOnly,
                                            const char* filename,
                                            long line,
                                            bool removeEmpty,
                                            bool replaceAt) const
{
  // This method replaces ${VAR} and @VAR@ where VAR is looked up
  // with GetDefinition(), if not found in the map, nothing is expanded.
  // It also supports the $ENV{VAR} syntax where VAR is looked up in
  // the current environment variables.

  const char* in = source.c_str();
  const char* last = in;
  std::string result;
  result.reserve(source.size());
  std::stack<t_lookup> openstack;
  bool error = false;
  bool done = false;
  openstack.push(t_lookup());
  cmake::MessageType mtype = cmake::LOG;

  cmState* state = this->GetCMakeInstance()->GetState();

  do
    {
    char inc = *in;
    switch(inc)
      {
      case '}':
        if(openstack.size() > 1)
          {
          t_lookup var = openstack.top();
          openstack.pop();
          result.append(last, in - last);
          std::string const& lookup = result.substr(var.loc);
          const char* value = NULL;
          std::string varresult;
          static const std::string lineVar = "CMAKE_CURRENT_LIST_LINE";
          switch(var.domain)
            {
            case NORMAL:
              if(filename && lookup == lineVar)
                {
                std::ostringstream ostr;
                ostr << line;
                varresult = ostr.str();
                }
              else
                {
                value = this->GetDefinition(lookup);
                }
              break;
            case ENVIRONMENT:
              value = cmSystemTools::GetEnv(lookup.c_str());
              break;
            case CACHE:
              value = state->GetCacheEntryValue(lookup);
              break;
            }
          // Get the string we're meant to append to.
          if(value)
            {
            if(escapeQuotes)
              {
              varresult = cmSystemTools::EscapeQuotes(value);
              }
            else
              {
              varresult = value;
              }
            }
          else if(!removeEmpty)
            {
            // check to see if we need to print a warning
            // if strict mode is on and the variable has
            // not been "cleared"/initialized with a set(foo ) call
            if(this->GetCMakeInstance()->GetWarnUninitialized() &&
               !this->VariableInitialized(lookup))
              {
              if (this->CheckSystemVars ||
                  cmSystemTools::IsSubDirectory(filename,
                                                this->GetHomeDirectory()) ||
                  cmSystemTools::IsSubDirectory(filename,
                                             this->GetHomeOutputDirectory()))
                {
                std::ostringstream msg;
                cmListFileContext lfc;
                cmOutputConverter converter(this->StateSnapshot);
                lfc.FilePath =
                    converter.Convert(filename, cmOutputConverter::HOME);
                lfc.Line = line;
                msg << "uninitialized variable \'" << lookup << "\'";
                this->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING,
                                                       msg.str(), lfc);
                }
              }
            }
          result.replace(var.loc, result.size() - var.loc, varresult);
          // Start looking from here on out.
          last = in + 1;
          }
        break;
      case '$':
        if(!atOnly)
          {
          t_lookup lookup;
          const char* next = in + 1;
          const char* start = NULL;
          char nextc = *next;
          if(nextc == '{')
            {
            // Looking for a variable.
            start = in + 2;
            lookup.domain = NORMAL;
            }
          else if(nextc == '<')
            {
            }
          else if(!nextc)
            {
            result.append(last, next - last);
            last = next;
            }
          else if(cmHasLiteralPrefix(next, "ENV{"))
            {
            // Looking for an environment variable.
            start = in + 5;
            lookup.domain = ENVIRONMENT;
            }
          else if(cmHasLiteralPrefix(next, "CACHE{"))
            {
            // Looking for a cache variable.
            start = in + 7;
            lookup.domain = CACHE;
            }
          else
            {
            if(this->cmNamedCurly.find(next))
              {
              errorstr = "Syntax $"
                  + std::string(next, this->cmNamedCurly.end())
                  + "{} is not supported.  Only ${}, $ENV{}, "
                    "and $CACHE{} are allowed.";
              mtype = cmake::FATAL_ERROR;
              error = true;
              }
            }
          if(start)
            {
            result.append(last, in - last);
            last = start;
            in = start - 1;
            lookup.loc = result.size();
            openstack.push(lookup);
            }
          break;
          }
      case '\\':
        if(!noEscapes)
          {
          const char* next = in + 1;
          char nextc = *next;
          if(nextc == 't')
            {
            result.append(last, in - last);
            result.append("\t");
            last = next + 1;
            }
          else if(nextc == 'n')
            {
            result.append(last, in - last);
            result.append("\n");
            last = next + 1;
            }
          else if(nextc == 'r')
            {
            result.append(last, in - last);
            result.append("\r");
            last = next + 1;
            }
          else if(nextc == ';' && openstack.size() == 1)
            {
            // Handled in ExpandListArgument; pass the backslash literally.
            }
          else if (isalnum(nextc) || nextc == '\0')
            {
            errorstr += "Invalid character escape '\\";
            if (nextc)
              {
              errorstr += nextc;
              errorstr += "'.";
              }
            else
              {
              errorstr += "' (at end of input).";
              }
            error = true;
            }
          else
            {
            // Take what we've found so far, skipping the escape character.
            result.append(last, in - last);
            // Start tracking from the next character.
            last = in + 1;
            }
          // Skip the next character since it was escaped, but don't read past
          // the end of the string.
          if(*last)
            {
            ++in;
            }
          }
        break;
      case '\n':
        // Onto the next line.
        ++line;
        break;
      case '\0':
        done = true;
        break;
      case '@':
        if(replaceAt)
          {
          const char* nextAt = strchr(in + 1, '@');
          if(nextAt && nextAt != in + 1 &&
             nextAt == in + 1 + strspn(in + 1,
                "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                "abcdefghijklmnopqrstuvwxyz"
                "0123456789/_.+-"))
            {
            std::string variable(in + 1, nextAt - in - 1);
            std::string varresult = this->GetSafeDefinition(variable);
            if(escapeQuotes)
              {
              varresult = cmSystemTools::EscapeQuotes(varresult);
              }
            // Skip over the variable.
            result.append(last, in - last);
            result.append(varresult);
            in = nextAt;
            last = in + 1;
            break;
            }
          }
        // Failed to find a valid @ expansion; treat it as literal.
        /* FALLTHROUGH */
      default:
        {
        if(openstack.size() > 1 &&
           !(isalnum(inc) || inc == '_' ||
             inc == '/' || inc == '.' ||
             inc == '+' || inc == '-'))
          {
          errorstr += "Invalid character (\'";
          errorstr += inc;
          result.append(last, in - last);
          errorstr += "\') in a variable name: "
                      "'" + result.substr(openstack.top().loc) + "'";
          mtype = cmake::FATAL_ERROR;
          error = true;
          }
        break;
        }
      }
    // Look at the next character.
    } while(!error && !done && *++in);

  // Check for open variable references yet.
  if(!error && openstack.size() != 1)
    {
    // There's an open variable reference waiting.  Policy CMP0010 flags
    // whether this is an error or not.  The new parser now enforces
    // CMP0010 as well.
    errorstr += "There is an unterminated variable reference.";
    error = true;
    }

  if(error)
    {
    std::ostringstream emsg;
    emsg << "Syntax error in cmake code ";
    if(filename)
      {
      // This filename and line number may be more specific than the
      // command context because one command invocation can have
      // arguments on multiple lines.
      emsg << "at\n"
            << "  " << filename << ":" << line << "\n";
      }
    emsg << "when parsing string\n"
         << "  " << source << "\n";
    emsg << errorstr;
    mtype = cmake::FATAL_ERROR;
    errorstr = emsg.str();
    }
  else
    {
    // Append the rest of the unchanged part of the string.
    result.append(last);

    source = result;
    }

  return mtype;
}